

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

int cs_impl::file_cs_ext::init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  name_space *func;
  string *name;
  __shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffdb0;
  allocator *paVar2;
  string *in_stack_fffffffffffffdb8;
  name_space *in_stack_fffffffffffffdc0;
  name_space *this;
  undefined8 in_stack_fffffffffffffde0;
  undefined1 uVar3;
  _func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *in_stack_fffffffffffffde8;
  allocator local_1b1;
  string local_1b0 [47];
  undefined1 local_181 [48];
  allocator local_151;
  string local_150 [47];
  allocator local_121;
  string local_120 [47];
  allocator local_f1;
  string local_f0 [47];
  allocator local_c1;
  string local_c0 [47];
  allocator local_91;
  string local_90 [47];
  allocator local_61;
  string local_60 [63];
  allocator local_21;
  string local_20 [32];
  
  uVar3 = (undefined1)((ulong)in_stack_fffffffffffffde0 >> 0x38);
  std::__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            (in_stack_fffffffffffffdb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_20,"copy",&local_21);
  cs::make_cni<bool(&)(std::__cxx11::string_const&,std::__cxx11::string_const&)>
            (in_stack_fffffffffffffde8,(bool)uVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,(var *)in_stack_fffffffffffffdb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"rename",&local_61);
  cs::make_cni<bool(&)(std::__cxx11::string_const&,std::__cxx11::string_const&)>
            (in_stack_fffffffffffffde8,(bool)uVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,(var *)in_stack_fffffffffffffdb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"remove",&local_91);
  cs::make_cni<bool(&)(std::__cxx11::string_const&)>
            ((_func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *)
             in_stack_fffffffffffffde8,(bool)uVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,(var *)in_stack_fffffffffffffdb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"exist",&local_c1);
  cs::make_cni<bool(&)(std::__cxx11::string_const&)>
            ((_func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *)
             in_stack_fffffffffffffde8,(bool)uVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,(var *)in_stack_fffffffffffffdb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"ctime",&local_f1);
  cs::make_cni<cs::numeric(&)(std::__cxx11::string_const&)>
            ((_func_numeric_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *)
             in_stack_fffffffffffffde8,(bool)uVar3);
  func = cs::name_space::add_var
                   (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                    (var *)in_stack_fffffffffffffdb0);
  paVar2 = &local_121;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"mtime",paVar2);
  uVar3 = (undefined1)((ulong)paVar2 >> 0x38);
  cs::make_cni<cs::numeric(&)(std::__cxx11::string_const&)>
            ((_func_numeric_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *)
             func,(bool)uVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,(var *)in_stack_fffffffffffffdb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"can_read",&local_151);
  cs::make_cni<bool(&)(std::__cxx11::string_const&)>
            ((_func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *)
             func,(bool)uVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,(var *)in_stack_fffffffffffffdb0);
  this = (name_space *)local_181;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_181 + 1),"can_write",(allocator *)this);
  cs::make_cni<bool(&)(std::__cxx11::string_const&)>
            ((_func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *)
             func,(bool)uVar3);
  name = (string *)
         cs::name_space::add_var(this,in_stack_fffffffffffffdb8,(var *)in_stack_fffffffffffffdb0);
  paVar2 = &local_1b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"can_execute",paVar2);
  cs::make_cni<bool(&)(std::__cxx11::string_const&)>
            ((_func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *)
             func,(bool)uVar3);
  cs::name_space::add_var(this,name,(var *)paVar2);
  any::~any((any *)0x2602c8);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  any::~any((any *)0x2602ef);
  std::__cxx11::string::~string((string *)(local_181 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_181);
  any::~any((any *)0x260316);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  any::~any((any *)0x26033d);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  any::~any((any *)0x260364);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  any::~any((any *)0x26038b);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  any::~any((any *)0x2603b2);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  any::~any((any *)0x2603d9);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  any::~any((any *)0x260400);
  std::__cxx11::string::~string(local_20);
  iVar1 = std::allocator<char>::~allocator((allocator<char> *)&local_21);
  return iVar1;
}

Assistant:

void init()
		{
			using namespace cs_impl::file_system;
			(*file_ext)
			.add_var("copy", make_cni(copy))
			.add_var("rename", make_cni(move))
			.add_var("remove", make_cni(remove))
			.add_var("exist", make_cni(exist))
			.add_var("ctime", make_cni(ctime))
			.add_var("mtime", make_cni(mtime))
			.add_var("can_read", make_cni(can_read))
			.add_var("can_write", make_cni(can_write))
			.add_var("can_execute", make_cni(can_execute));
		}